

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON_bool cJSON_InsertItemInArray(cJSON *array,int which,cJSON *newitem)

{
  cJSON *pcVar1;
  cJSON *after_inserted;
  cJSON *newitem_local;
  int which_local;
  cJSON *array_local;
  
  if ((which < 0) || (newitem == (cJSON *)0x0)) {
    array_local._4_4_ = 0;
  }
  else {
    pcVar1 = get_array_item(array,(long)which);
    if (pcVar1 == (cJSON *)0x0) {
      array_local._4_4_ = add_item_to_array(array,newitem);
    }
    else if ((pcVar1 == array->child) || (pcVar1->prev != (cJSON *)0x0)) {
      newitem->next = pcVar1;
      newitem->prev = pcVar1->prev;
      pcVar1->prev = newitem;
      if (pcVar1 == array->child) {
        array->child = newitem;
      }
      else {
        newitem->prev->next = newitem;
      }
      array_local._4_4_ = 1;
    }
    else {
      array_local._4_4_ = 0;
    }
  }
  return array_local._4_4_;
}

Assistant:

CJSON_PUBLIC(cJSON_bool) cJSON_InsertItemInArray(cJSON *array, int which, cJSON *newitem)
{
    cJSON *after_inserted = NULL;

    if (which < 0 || newitem == NULL)
    {
        return false;
    }

    after_inserted = get_array_item(array, (size_t)which);
    if (after_inserted == NULL)
    {
        return add_item_to_array(array, newitem);
    }

    if (after_inserted != array->child && after_inserted->prev == NULL) {
        /* return false if after_inserted is a corrupted array item */
        return false;
    }

    newitem->next = after_inserted;
    newitem->prev = after_inserted->prev;
    after_inserted->prev = newitem;
    if (after_inserted == array->child)
    {
        array->child = newitem;
    }
    else
    {
        newitem->prev->next = newitem;
    }
    return true;
}